

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * adios2sys::SystemTools::GetProgramPath(string *in_name)

{
  undefined8 in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  string *in_stack_00000008;
  string file;
  string *dir;
  string local_38 [39];
  byte local_11;
  undefined1 uVar1;
  string *file_00;
  
  uVar1 = (undefined1)((ulong)in_RSI >> 0x38);
  local_11 = 0;
  file_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::string(local_38);
  SplitProgramPath(in_stack_00000008,unaff_retaddr,file_00,(bool)uVar1);
  local_11 = 1;
  std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::GetProgramPath(const std::string& in_name)
{
  std::string dir, file;
  SystemTools::SplitProgramPath(in_name, dir, file);
  return dir;
}